

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  word *pwVar9;
  
  iVar2 = vTemp->nSize;
  if (iVar2 != p->nObjs) {
    __assert_fail("Vec_WrdSize(vTemp) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0x7d,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  if (-1 < iObj) {
    iVar3 = p->vMapping->nSize;
    if (iObj < iVar3) {
      piVar6 = p->vMapping->pArray;
      uVar4 = piVar6[(uint)iObj];
      if ((ulong)uVar4 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                      ,0x7e,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
      }
      if ((int)uVar4 < iVar3 && -1 < (int)uVar4) {
        puVar1 = (uint *)(piVar6 + uVar4);
        uVar5 = *puVar1;
        uVar7 = 0;
        uVar8 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar8 = uVar7;
        }
        pwVar9 = s_Truths6;
        do {
          if (uVar8 == uVar7) {
            if (6 < uVar7) {
              __assert_fail("i <= 6",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                            ,0x81,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)"
                           );
            }
            Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
            if (iObj < vTemp->nSize) {
              return vTemp->pArray[(uint)iObj];
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          uVar5 = puVar1[uVar7 + 1];
          if (((long)(int)uVar5 < 0) || (iVar2 <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          vTemp->pArray[(int)uVar5] = *pwVar9;
          uVar7 = uVar7 + 1;
          pwVar9 = pwVar9 + 1;
        } while ((int)uVar4 < iVar3 && -1 < (int)uVar4);
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

word Gia_ObjComputeTruthTable6Lut( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_LutForEachFanin( p, iObj, Fanin, i )
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    assert( i <= 6 );
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}